

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function.cpp
# Opt level: O1

void Image_Function::ConvertToRgb
               (Image *in,uint32_t startXIn,uint32_t startYIn,Image *out,uint32_t startXOut,
               uint32_t startYOut,uint32_t width,uint32_t height)

{
  uchar uVar1;
  uint uVar2;
  uint uVar3;
  uchar *puVar4;
  uchar *puVar5;
  uchar *puVar6;
  ulong uVar7;
  uchar *puVar8;
  
  ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            (in,startXIn,startYIn,out,startXOut,startYOut,width,height);
  VerifyRGBImage<PenguinV_Image::ImageTemplate<unsigned_char>>(out);
  if (in->_colorCount == '\x03') {
    Copy(in,startXIn,startYIn,out,startXOut,startYOut,width,height);
    return;
  }
  uVar2 = out->_rowSize;
  if (height * uVar2 != 0) {
    puVar4 = out->_data + (ulong)(startXOut * 3) + (ulong)(startYOut * uVar2);
    puVar5 = puVar4 + height * uVar2;
    uVar3 = in->_rowSize;
    puVar6 = in->_data + (ulong)startXIn + (ulong)(startYIn * uVar3);
    do {
      if (width != 0) {
        uVar7 = 0;
        puVar8 = puVar6;
        do {
          uVar1 = *puVar8;
          puVar4[uVar7 + 2] = uVar1;
          *(ushort *)(puVar4 + uVar7) = CONCAT11(uVar1,uVar1);
          puVar8 = puVar8 + 1;
          uVar7 = uVar7 + 3;
        } while (width * 3 != uVar7);
      }
      puVar4 = puVar4 + uVar2;
      puVar6 = puVar6 + uVar3;
    } while (puVar4 != puVar5);
  }
  return;
}

Assistant:

void ConvertToRgb( const Image & in, uint32_t startXIn, uint32_t startYIn, Image & out, uint32_t startXOut, uint32_t startYOut,
                       uint32_t width, uint32_t height )
    {
        ParameterValidation( in, startXIn, startYIn, out, startXOut, startYOut, width, height );
        VerifyRGBImage     ( out );

        if( in.colorCount() == RGB ) {
            Copy( in, startXIn, startYIn, out, startXOut, startYOut, width, height );
            return;
        }

        const uint32_t rowSizeIn  = in.rowSize();
        const uint32_t rowSizeOut = out.rowSize();

        const uint8_t colorCount = RGB;

        const uint8_t * inY  = in.data()  + startYIn  * rowSizeIn  + startXIn;
        uint8_t       * outY = out.data() + startYOut * rowSizeOut + startXOut * colorCount;

        const uint8_t * outYEnd = outY + height * rowSizeOut;

        width = width * colorCount;

        for( ; outY != outYEnd; outY += rowSizeOut, inY += rowSizeIn ) {
            const uint8_t * inX  = inY;
            uint8_t       * outX = outY;

            const uint8_t * outXEnd = outX + width;

            for( ; outX != outXEnd; outX += colorCount, ++inX )
                memset( outX, (*inX), sizeof( uint8_t ) * colorCount );
        }
    }